

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitCallRef(InternalAnalyzer *this,CallRef *curr)

{
  bool bVar1;
  CallRef *curr_local;
  InternalAnalyzer *this_local;
  
  if ((curr->isReturn & 1U) != 0) {
    this->parent->branchesOut = true;
    bVar1 = FeatureSet::hasExceptionHandling(&this->parent->features);
    if (bVar1) {
      this->parent->hasReturnCallThrow = true;
    }
  }
  bVar1 = wasm::Type::isNull(&curr->target->type);
  if (bVar1) {
    this->parent->trap = true;
  }
  else {
    bVar1 = wasm::Type::isNullable(&curr->target->type);
    if (bVar1) {
      this->parent->implicitTrap = true;
    }
    this->parent->calls = true;
    bVar1 = FeatureSet::hasExceptionHandling(&this->parent->features);
    if (((bVar1) && (this->parent->tryDepth == 0)) && ((curr->isReturn & 1U) == 0)) {
      this->parent->throws_ = true;
    }
  }
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
      if (curr->isReturn) {
        parent.branchesOut = true;
        if (parent.features.hasExceptionHandling()) {
          parent.hasReturnCallThrow = true;
        }
      }
      if (curr->target->type.isNull()) {
        parent.trap = true;
        return;
      }
      // traps when the call target is null
      if (curr->target->type.isNullable()) {
        parent.implicitTrap = true;
      }

      parent.calls = true;
      if (parent.features.hasExceptionHandling() &&
          (parent.tryDepth == 0 && !curr->isReturn)) {
        parent.throws_ = true;
      }
    }